

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture3D_GL.cpp
# Opt level: O1

void __thiscall
Diligent::Texture3D_GL::CopyTexSubimage
          (Texture3D_GL *this,GLContextState *GLState,CopyTexSubimageAttribs *Attribs)

{
  Box *pBVar1;
  GLenum err;
  string msg;
  
  GLContextState::BindTexture
            (GLState,-1,(this->super_TextureBaseGL).m_BindTarget,
             &(this->super_TextureBaseGL).m_GlTexture);
  pBVar1 = Attribs->SrcBox;
  (*__glewCopyTexSubImage3D)
            ((this->super_TextureBaseGL).m_BindTarget,Attribs->DstMip,Attribs->DstX,Attribs->DstY,
             Attribs->DstZ,pBVar1->MinX,pBVar1->MinY,pBVar1->MaxX - pBVar1->MinX,
             pBVar1->MaxY - pBVar1->MinY);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[43],char[17],unsigned_int>
              (false,"CopyTexSubimage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture3D_GL.cpp"
               ,0xfd,(char (*) [43])"Failed to copy subimage data to texture 3D",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&msg,(char (*) [6])0x32952e);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CopyTexSubimage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture3D_GL.cpp"
               ,0xfd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Texture3D_GL::CopyTexSubimage(GLContextState& GLState, const CopyTexSubimageAttribs& Attribs)
{
    GLState.BindTexture(-1, GetBindTarget(), GetGLHandle());

    glCopyTexSubImage3D(GetBindTarget(),
                        Attribs.DstMip,
                        Attribs.DstX,
                        Attribs.DstY,
                        Attribs.DstZ,
                        Attribs.SrcBox.MinX,
                        Attribs.SrcBox.MinY,
                        Attribs.SrcBox.Width(),
                        Attribs.SrcBox.Height());
    DEV_CHECK_GL_ERROR("Failed to copy subimage data to texture 3D");
}